

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O3

void __thiscall
ObjectFileDB::ObjectFileDB
          (ObjectFileDB *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_dgos)

{
  uint uVar1;
  uint uVar2;
  pointer pbVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dgo;
  pointer filename;
  Timer timer;
  Timer local_38;
  
  (this->obj_files_by_name)._M_h._M_buckets = &(this->obj_files_by_name)._M_h._M_single_bucket;
  (this->obj_files_by_name)._M_h._M_bucket_count = 1;
  (this->obj_files_by_name)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->obj_files_by_name)._M_h._M_element_count = 0;
  (this->obj_files_by_name)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->obj_files_by_name)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->obj_files_by_name)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->obj_files_by_dgo)._M_h._M_buckets = &(this->obj_files_by_dgo)._M_h._M_single_bucket;
  (this->obj_files_by_dgo)._M_h._M_bucket_count = 1;
  (this->obj_files_by_dgo)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->obj_files_by_dgo)._M_h._M_element_count = 0;
  (this->obj_files_by_dgo)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->obj_files_by_dgo)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->obj_files_by_dgo)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->obj_file_order).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obj_file_order).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obj_file_order).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stats).total_dgo_bytes = 0;
  (this->stats).total_obj_files = 0;
  (this->stats).unique_obj_files = 0;
  (this->stats).unique_obj_bytes = 0;
  local_38._startTime.tv_sec = 0;
  local_38._startTime.tv_nsec = 0;
  Timer::start(&local_38);
  puts("- Initializing ObjectFileDB...");
  pbVar3 = (_dgos->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (filename = (_dgos->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; filename != pbVar3;
      filename = filename + 1) {
    get_objs_from_dgo(this,filename);
  }
  puts("ObjectFileDB Initialized:");
  printf(" total dgos: %ld\n",
         (long)(_dgos->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(_dgos->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5);
  printf(" total data: %d bytes\n",(ulong)(this->stats).total_dgo_bytes);
  printf(" total objs: %d\n",(ulong)(this->stats).total_obj_files);
  printf(" unique objs: %d\n",(ulong)(this->stats).unique_obj_files);
  printf(" unique data: %d bytes\n",(ulong)(this->stats).unique_obj_bytes);
  iVar4 = Timer::getNs(&local_38);
  uVar1 = (this->stats).total_dgo_bytes;
  iVar5 = Timer::getNs(&local_38);
  uVar2 = (this->stats).total_obj_files;
  iVar6 = Timer::getNs(&local_38);
  printf(" total %.1f ms (%.3f MB/sec, %.3f obj/sec)\n",SUB84((double)iVar4 / 1000000.0,0),
         (double)uVar1 / (((double)iVar5 / 1000000000.0) * 1048576.0),
         (double)uVar2 / ((double)iVar6 / 1000000000.0));
  putchar(10);
  return;
}

Assistant:

ObjectFileDB::ObjectFileDB(const std::vector<std::string>& _dgos) {
  Timer timer;

  printf("- Initializing ObjectFileDB...\n");
  for (auto& dgo : _dgos) {
    get_objs_from_dgo(dgo);
  }

  printf("ObjectFileDB Initialized:\n");
  printf(" total dgos: %ld\n", _dgos.size());
  printf(" total data: %d bytes\n", stats.total_dgo_bytes);
  printf(" total objs: %d\n", stats.total_obj_files);
  printf(" unique objs: %d\n", stats.unique_obj_files);
  printf(" unique data: %d bytes\n", stats.unique_obj_bytes);
  printf(" total %.1f ms (%.3f MB/sec, %.3f obj/sec)\n", timer.getMs(),
         stats.total_dgo_bytes / ((1u << 20u) * timer.getSeconds()),
         stats.total_obj_files / timer.getSeconds());
  printf("\n");
}